

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spake25519.cc
# Opt level: O1

SPAKE2_CTX *
SPAKE2_CTX_new(spake2_role_t my_role,uint8_t *my_name,size_t my_name_len,uint8_t *their_name,
              size_t their_name_len)

{
  int iVar1;
  SPAKE2_CTX *ctx;
  CBS their_name_cbs;
  CBS my_name_cbs;
  CBS local_50;
  CBS local_40;
  
  ctx = (SPAKE2_CTX *)OPENSSL_zalloc(0xd0);
  if (ctx != (SPAKE2_CTX *)0x0) {
    ctx->my_role = my_role;
    local_50.data = their_name;
    local_50.len = their_name_len;
    local_40.data = my_name;
    local_40.len = my_name_len;
    iVar1 = CBS_stow(&local_40,&ctx->my_name,&ctx->my_name_len);
    if ((iVar1 != 0) &&
       (iVar1 = CBS_stow(&local_50,&ctx->their_name,&ctx->their_name_len), iVar1 != 0)) {
      return ctx;
    }
    SPAKE2_CTX_free(ctx);
  }
  return (SPAKE2_CTX *)0x0;
}

Assistant:

SPAKE2_CTX *SPAKE2_CTX_new(enum spake2_role_t my_role, const uint8_t *my_name,
                           size_t my_name_len, const uint8_t *their_name,
                           size_t their_name_len) {
  SPAKE2_CTX *ctx =
      reinterpret_cast<SPAKE2_CTX *>(OPENSSL_zalloc(sizeof(SPAKE2_CTX)));
  if (ctx == NULL) {
    return NULL;
  }

  ctx->my_role = my_role;

  CBS my_name_cbs, their_name_cbs;
  CBS_init(&my_name_cbs, my_name, my_name_len);
  CBS_init(&their_name_cbs, their_name, their_name_len);
  if (!CBS_stow(&my_name_cbs, &ctx->my_name, &ctx->my_name_len) ||
      !CBS_stow(&their_name_cbs, &ctx->their_name, &ctx->their_name_len)) {
    SPAKE2_CTX_free(ctx);
    return NULL;
  }

  return ctx;
}